

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O2

_Bool stk_MoveCardFromTo(SolStack_t *sourcePtr,SolStack_t *targetPtr)

{
  ulong uVar1;
  _Bool _Var2;
  Card_t card;
  Card_t local_20;
  
  if (targetPtr != (SolStack_t *)0x0 && sourcePtr != (SolStack_t *)0x0) {
    _Var2 = stk_Pop(sourcePtr,&local_20);
    if (_Var2) {
      uVar1 = targetPtr->m_size;
      _Var2 = uVar1 < 0x34;
      if (_Var2) {
        targetPtr->m_size = uVar1 + 1;
        targetPtr->m_cards[uVar1].m_type = local_20.m_type;
        targetPtr->m_cards[uVar1].m_color = local_20.m_color;
        targetPtr->m_cards[uVar1].m_face = local_20.m_face;
        if (sourcePtr->m_size != 0) {
          sourcePtr->m_cards[sourcePtr->m_size - 1].m_face = CF_UP;
        }
      }
      else {
        uVar1 = sourcePtr->m_size;
        if (uVar1 < 0x34) {
          sourcePtr->m_size = uVar1 + 1;
          sourcePtr->m_cards[uVar1].m_type = local_20.m_type;
          sourcePtr->m_cards[uVar1].m_color = local_20.m_color;
          sourcePtr->m_cards[uVar1].m_face = local_20.m_face;
        }
      }
    }
    else {
      _Var2 = false;
    }
    return _Var2;
  }
  return false;
}

Assistant:

bool stk_MoveCardFromTo(SolStack_t* sourcePtr, SolStack_t* targetPtr)
{
  if (sourcePtr && targetPtr) {
    Card_t card;
    if (stk_Pop(sourcePtr, &card)) {
      if (stk_PushCopy(targetPtr, card)) {
        stk_TurnTopCardUp(sourcePtr);
        return true;
      } else {
        // target stack is probably full, push the card back to source
        stk_PushCopy(sourcePtr, card);
        return false;
      }
    }
  }
  return false;
}